

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O2

void __thiscall
KDReports::AutoTableElement::AutoTableElement(AutoTableElement *this,AutoTableElement *other)

{
  AutoTableElementPrivate *this_00;
  
  AbstractTableElement::AbstractTableElement
            (&this->super_AbstractTableElement,&other->super_AbstractTableElement);
  (this->super_AbstractTableElement).super_Element._vptr_Element =
       (_func_int **)&PTR__AutoTableElement_00170298;
  this_00 = (AutoTableElementPrivate *)operator_new(0x78);
  AutoTableElementPrivate::AutoTableElementPrivate
            (this_00,(other->d)._M_t.
                     super___uniq_ptr_impl<KDReports::AutoTableElementPrivate,_std::default_delete<KDReports::AutoTableElementPrivate>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_KDReports::AutoTableElementPrivate_*,_std::default_delete<KDReports::AutoTableElementPrivate>_>
                     .super__Head_base<0UL,_KDReports::AutoTableElementPrivate_*,_false>.
                     _M_head_impl);
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::AutoTableElementPrivate,_std::default_delete<KDReports::AutoTableElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::AutoTableElementPrivate_*,_std::default_delete<KDReports::AutoTableElementPrivate>_>
  .super__Head_base<0UL,_KDReports::AutoTableElementPrivate_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

KDReports::AutoTableElement::AutoTableElement(const AutoTableElement &other)
    : AbstractTableElement(other)
    , d(new AutoTableElementPrivate(*other.d))
{
}